

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

char * keyword2str(yang_token keyword)

{
  char *pcVar1;
  
  if (keyword - YANG_ANYXML < 0x44) {
    pcVar1 = &DAT_001052b8 + *(int *)(&DAT_001052b8 + (ulong)(keyword - YANG_ANYXML) * 4);
  }
  else {
    pcVar1 = "";
  }
  return pcVar1;
}

Assistant:

static const char *
keyword2str(enum yang_token keyword)
{
    switch (keyword) {
    case YANG_ANYXML:
        return "anyxml";
    case YANG_ARGUMENT:
        return "argument";
    case YANG_AUGMENT:
        return "augment";
    case YANG_BASE:
        return "base";
    case YANG_BELONGS_TO:
        return "belongs-to";
    case YANG_BIT:
        return "bit";
    case YANG_CASE:
        return "case";
    case YANG_CHOICE:
        return "choice";
    case YANG_CONFIG:
        return "config";
    case YANG_CONTACT:
        return "contact";
    case YANG_CONTAINER:
        return "container";
    case YANG_DEFAULT:
        return "default";
    case YANG_DESCRIPTION:
        return "description";
    case YANG_DEVIATE:
        return "deviate";
    case YANG_DEVIATION:
        return "deviation";
    case YANG_ENUM:
        return "enum";
    case YANG_ERROR_APP_TAG:
        return "error-app-tag";
    case YANG_ERROR_MESSAGE:
        return "error-message";
    case YANG_EXTENSION:
        return "extension";
    case YANG_FEATURE:
        return "feature";
    case YANG_FRACTION_DIGITS:
        return "fraction-digits";
    case YANG_GROUPING:
        return "grouping";
    case YANG_IDENTITY:
        return "identitiy";
    case YANG_IF_FEATURE:
        return "if-feature";
    case YANG_IMPORT:
        return "import";
    case YANG_INCLUDE:
        return "include";
    case YANG_INPUT:
        return "input";
    case YANG_KEY:
        return "key";
    case YANG_LEAF:
        return "leaf";
    case YANG_LEAF_LIST:
        return "leaf-list";
    case YANG_LENGTH:
        return "length";
    case YANG_LIST:
        return "list";
    case YANG_MANDATORY:
        return "mandatory";
    case YANG_MAX_ELEMENTS:
        return "max-elements";
    case YANG_MIN_ELEMENTS:
        return "min-elements";
    case YANG_MODULE:
        return "module";
    case YANG_MUST:
        return "must";
    case YANG_NAMESPACE:
        return "namespace";
    case YANG_NOTIFICATION:
        return "notification";
    case YANG_ORDERED_BY:
        return "ordered-by";
    case YANG_ORGANIZATION:
        return "organization";
    case YANG_OUTPUT:
        return "output";
    case YANG_PATH:
        return "path";
    case YANG_PATTERN:
        return "pattern";
    case YANG_POSITION:
        return "position";
    case YANG_PREFIX:
        return "prefix";
    case YANG_PRESENCE:
        return "presence";
    case YANG_RANGE:
        return "range";
    case YANG_REFERENCE:
        return "reference";
    case YANG_REFINE:
        return "refine";
    case YANG_REQUIRE_INSTANCE:
        return "require-instance";
    case YANG_REVISION:
        return "revision";
    case YANG_REVISION_DATE:
        return "revision-date";
    case YANG_RPC:
        return "rpc";
    case YANG_STATUS:
        return "status";
    case YANG_SUBMODULE:
        return "submodule";
    case YANG_TYPE:
        return "type";
    case YANG_TYPEDEF:
        return "typedef";
    case YANG_UNIQUE:
        return "unique";
    case YANG_UNITS:
        return "units";
    case YANG_USES:
        return "uses";
    case YANG_VALUE:
        return "value";
    case YANG_WHEN:
        return "when";
    case YANG_YANG_VERSION:
        return "yang-version";
    case YANG_YIN_ELEMENT:
        return "yin-element";
    case YANG_SEMICOLON:
        return ";";
    case YANG_LEFT_BRACE:
        return "{";
    case YANG_RIGHT_BRACE:
        return "}";
    default:
        return "";
    }
}